

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O1

OutputFile * __thiscall re2c::OutputFile::wrank(OutputFile *this,rule_rank_t r)

{
  operator<<((ostream *)
             &((this->blocks).
               super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>._M_impl
               .super__Vector_impl_data._M_finish[-1]->fragments).
              super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>.
              _M_impl.super__Vector_impl_data._M_finish[-1]->stream,r);
  return this;
}

Assistant:

OutputFile & OutputFile::wrank (rule_rank_t r)
{
	stream () << r;
	return *this;
}